

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  SessionHandle *data;
  undefined8 uVar1;
  int iVar2;
  _Bool _Var3;
  uint uVar4;
  CURLcode CVar5;
  CURLcode CVar6;
  long lVar7;
  int *piVar8;
  char *pcVar9;
  ulong uVar10;
  int error;
  char ipaddress [46];
  int local_94;
  long local_90;
  timeval local_88;
  _Bool *local_78;
  ulong local_70;
  char local_68 [56];
  
  data = conn->data;
  local_94 = 0;
  *connected = false;
  if ((conn->bits).tcpconnect[sockindex] == true) {
    *connected = true;
  }
  else {
    local_88 = curlx_tvnow();
    local_70 = Curl_timeleft(data,&local_88,true);
    if ((long)local_70 < 0) {
      Curl_failf(data,"Connection time-out");
      return CURLE_OPERATION_TIMEDOUT;
    }
    uVar10 = 0;
    CVar5 = CURLE_OK;
    local_90 = (long)sockindex;
    local_78 = connected;
    do {
      if (conn->tempsock[uVar10] != -1) {
        uVar4 = Curl_socket_check(-1,-1,conn->tempsock[uVar10],0);
        if (uVar4 == 2) {
          _Var3 = verifyconnect(conn->tempsock[uVar10],&local_94);
          if (_Var3) {
            conn->sock[local_90] = conn->tempsock[uVar10];
            conn->ip_addr = conn->tempaddr[uVar10];
            conn->tempsock[uVar10] = -1;
            if (conn->tempsock[uVar10 ^ 1] != -1) {
              Curl_closesocket(conn,conn->tempsock[uVar10 ^ 1]);
              conn->tempsock[uVar10 ^ 1] = -1;
            }
            CVar5 = Curl_connected_proxy(conn,sockindex);
            lVar7 = local_90;
            if (CVar5 == CURLE_OK) {
              (conn->bits).tcpconnect[local_90] = true;
              *local_78 = true;
              if (sockindex == 0) {
                Curl_pgrsTime(data,TIMER_CONNECT);
              }
              Curl_updateconninfo(conn,conn->sock[lVar7]);
              Curl_verboseconnect(conn);
              return CURLE_OK;
            }
            return CVar5;
          }
          Curl_infof(data,"Connection failed\n");
        }
        else if (uVar4 == 0) {
          lVar7 = curlx_tvdiff(local_88,conn->connecttime);
          if (conn->timeoutms_per_addr <= lVar7) {
            Curl_infof(data,"After %ldms connect time, move on!\n");
            local_94 = 0x6e;
          }
          if (((uVar10 == 0) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
             (lVar7 = curlx_tvdiff(local_88,conn->connecttime), 199 < lVar7)) {
            trynextip(conn,sockindex,1);
          }
        }
        else if ((uVar4 & 4) != 0) {
          verifyconnect(conn->tempsock[uVar10],&local_94);
        }
        iVar2 = local_94;
        if (local_94 != 0) {
          (data->state).os_errno = local_94;
          piVar8 = __errno_location();
          *piVar8 = iVar2;
          if (conn->tempaddr[uVar10] != (Curl_addrinfo *)0x0) {
            Curl_printable_address(conn->tempaddr[uVar10],local_68,0x2e);
            lVar7 = conn->port;
            pcVar9 = Curl_strerror(conn,local_94);
            Curl_infof(data,"connect to %s port %ld failed: %s\n",local_68,lVar7,pcVar9);
            conn->timeoutms_per_addr =
                 local_70 >> (conn->tempaddr[uVar10]->ai_next != (Curl_addrinfo *)0x0);
            CVar5 = trynextip(conn,sockindex,(int)uVar10);
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 == 1);
    if (CVar5 == CURLE_OK) {
      return CURLE_OK;
    }
    if ((conn->tempaddr[1] != (Curl_addrinfo *)0x0) ||
       (CVar6 = trynextip(conn,sockindex,1), CVar6 != CURLE_OK)) {
      uVar1 = *(undefined8 *)(conn->primary_ip + (ulong)(conn->bits).proxy * 0x20 + -0x3c);
      lVar7 = conn->port;
      pcVar9 = Curl_strerror(conn,local_94);
      Curl_failf(data,"Failed to connect to %s port %ld: %s",uVar1,lVar7,pcVar9);
      return CVar5;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct SessionHandle *data = conn->data;
  CURLcode code = CURLE_OK;
  long allow;
  int error = 0;
  struct timeval now;
  int result;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_tvnow();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  for(i=0; i<2; i++) {
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    result = Curl_socket_ready(CURL_SOCKET_BAD, conn->tempsock[i], 0);

    if(result == 0) { /* no connection yet */
      if(curlx_tvdiff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %ldms connect time, move on!\n",
              conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         curlx_tvdiff(now, conn->connecttime) >= HAPPY_EYEBALLS_TIMEOUT) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(result == CURL_CSELECT_OUT) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */
        int other = i ^ 1;

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to do any proxy magic first once we connected */
        code = Curl_connected_proxy(conn, sockindex);
        if(code)
          return code;

        conn->bits.tcpconnect[sockindex] = TRUE;

        *connected = TRUE;
        if(sockindex == FIRSTSOCKET)
          Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
        Curl_updateconninfo(conn, conn->sock[sockindex]);
        Curl_verboseconnect(conn);

        return CURLE_OK;
      }
      else
        infof(data, "Connection failed\n");
    }
    else if(result & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      char ipaddress[MAX_IPADR_LEN];
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port, Curl_strerror(conn, error));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
                                   allow : allow / 2;

        code = trynextip(conn, sockindex, i);
      }
    }
  }

  if(code) {
    /* no more addresses to try */

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      int rc;
      rc = trynextip(conn, sockindex, 1);
      if(rc == CURLE_OK)
        return CURLE_OK;
    }

    failf(data, "Failed to connect to %s port %ld: %s",
          conn->bits.proxy?conn->proxy.name:conn->host.name,
          conn->port, Curl_strerror(conn, error));
  }

  return code;
}